

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsBroker_impl.hpp
# Opt level: O0

void __thiscall
helics::CommsBroker<helics::inproc::InprocComms,_helics::CoreBroker>::CommsBroker
          (CommsBroker<helics::inproc::InprocComms,_helics::CoreBroker> *this)

{
  unique_ptr<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_> *in_RDI
  ;
  CoreBroker *unaff_retaddr;
  CommsBroker<helics::inproc::InprocComms,_helics::CoreBroker> *in_stack_00000080;
  __integral_type_conflict1 __i;
  undefined1 __i_00;
  
  __i = 0;
  CoreBroker::CoreBroker(unaff_retaddr,SUB81((ulong)in_RDI >> 0x38,0));
  (in_RDI->_M_t).
  super___uniq_ptr_impl<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_>
  ._M_t.
  super__Tuple_impl<0UL,_helics::inproc::InprocComms_*,_std::default_delete<helics::inproc::InprocComms>_>
  .super__Head_base<0UL,_helics::inproc::InprocComms_*,_false>._M_head_impl =
       (InprocComms *)&PTR__CommsBroker_00a58800;
  in_RDI[1]._M_t.
  super___uniq_ptr_impl<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_>
  ._M_t.
  super__Tuple_impl<0UL,_helics::inproc::InprocComms_*,_std::default_delete<helics::inproc::InprocComms>_>
  .super__Head_base<0UL,_helics::inproc::InprocComms_*,_false>._M_head_impl =
       (InprocComms *)&PTR__CommsBroker_00a58958;
  std::atomic<int>::atomic((atomic<int> *)in_RDI,__i);
  __i_00 = (undefined1)((uint)__i >> 0x18);
  std::unique_ptr<helics::inproc::InprocComms,std::default_delete<helics::inproc::InprocComms>>::
  unique_ptr<std::default_delete<helics::inproc::InprocComms>,void>(in_RDI);
  CLI::std::atomic<bool>::atomic((atomic<bool> *)in_RDI,(bool)__i_00);
  loadComms(in_stack_00000080);
  return;
}

Assistant:

CommsBroker<COMMS, BrokerT>::CommsBroker() noexcept
{
    static_assert(std::is_base_of<CommsInterface, COMMS>::value,
                  "COMMS object must be a CommsInterface Object");
    static_assert(std::is_base_of<BrokerBase, BrokerT>::value,
                  "Broker must be an object  with a base of BrokerBase");
    loadComms();
}